

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

Directory *
CompoundFile::loadChildDir
          (map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
           *dirs,int32_t dirID,Stream *stream)

{
  size_type sVar1;
  mapped_type *pmVar2;
  int local_4c;
  Directory local_48;
  
  if ((dirID != -1) &&
     (local_4c = dirID,
     sVar1 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::count(dirs,&local_4c), sVar1 == 0)) {
    (*(stream->super_Stream)._vptr_Stream[4])(stream,(ulong)(uint)(local_4c << 7),0);
    local_48.m_name._M_dataplus._M_p = (pointer)&local_48.m_name.field_2;
    local_48.m_name._M_string_length = 0;
    local_48.m_name.field_2._M_local_buf[0] = L'\0';
    local_48.m_type = Empty;
    local_48.m_secID.m_id = -2;
    local_48.m_streamSize = 0;
    local_48.m_rightChild = -1;
    local_48.m_leftChild = -1;
    local_48.m_rootNode = -1;
    Directory::load(&local_48,stream);
    pmVar2 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[](dirs,&local_4c);
    Directory::operator=(pmVar2,&local_48);
    pmVar2 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[](dirs,&local_4c);
    std::__cxx11::wstring::~wstring((wstring *)&local_48);
    return pmVar2;
  }
  return (Directory *)0x0;
}

Assistant:

inline Directory *
loadChildDir( std::map< int32_t, Directory > & dirs,
	int32_t dirID, Stream & stream )
{
	if( dirID != -1 && dirs.count(dirID) == 0 )
	{
		stream.seek( dirID * dirRecordSize, Stream::FromBeginning );

		Directory dir;
		dir.load( stream );

		dirs[ dirID ] = dir;

		return &dirs[ dirID ];
	}

	return nullptr;
}